

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agent.c
# Opt level: O1

int agent_transact_unix(LIBSSH2_AGENT *agent,agent_transaction_ctx_t transctx)

{
  libssh2_socket_t lVar1;
  _func_ssize_t_libssh2_socket_t_void_ptr_size_t_int_void_ptr_ptr *p_Var2;
  int iVar3;
  uint32_t uVar4;
  ulong uVar5;
  ulong uVar6;
  agent_transaction_ctx_t paVar7;
  uchar *puVar8;
  ulong uVar9;
  agent_transaction_ctx_t paVar10;
  size_t sVar11;
  char *errmsg;
  LIBSSH2_SESSION *pLVar12;
  ulong uVar13;
  agent_transaction_ctx_t paVar14;
  uchar buf [4];
  uchar local_44 [4];
  agent_transaction_ctx_t local_40;
  _func_ssize_t_libssh2_socket_t_void_ptr_size_t_int_void_ptr_ptr *local_38;
  
  local_40 = transctx;
  if (transctx->state == agent_NB_state_request_created) {
    _libssh2_htonu32(local_44,(uint32_t)transctx->request_len);
    pLVar12 = agent->session;
    p_Var2 = pLVar12->send;
    lVar1 = agent->fd;
    uVar13 = 0;
    do {
      uVar5 = uVar13;
      if (3 < uVar13) break;
      uVar5 = (*p_Var2)(lVar1,local_44 + uVar13,4 - uVar13,0,&pLVar12->abstract);
      uVar6 = 0;
      if (-1 < (long)uVar5) {
        uVar6 = uVar5;
      }
      uVar13 = uVar13 + uVar6;
    } while (-1 < (long)uVar5);
    if ((int)uVar5 == -0xb) {
      return -0x25;
    }
    if (-1 < (int)uVar5) {
      local_40->state = agent_NB_state_request_length_sent;
      goto LAB_001084f5;
    }
LAB_001085c7:
    pLVar12 = agent->session;
    errmsg = "agent send failed";
  }
  else {
LAB_001084f5:
    if (local_40->state == agent_NB_state_request_length_sent) {
      pLVar12 = agent->session;
      local_38 = pLVar12->send;
      lVar1 = agent->fd;
      puVar8 = local_40->request;
      uVar13 = local_40->request_len;
      uVar5 = 0;
      do {
        sVar11 = uVar13 - uVar5;
        uVar6 = uVar5;
        if (uVar13 < uVar5 || sVar11 == 0) break;
        uVar6 = (*local_38)(lVar1,puVar8 + uVar5,sVar11,0,&pLVar12->abstract);
        uVar9 = 0;
        if (-1 < (long)uVar6) {
          uVar9 = uVar6;
        }
        uVar5 = uVar5 + uVar9;
      } while (-1 < (long)uVar6);
      if ((int)uVar6 == -0xb) {
        return -0x25;
      }
      if ((int)uVar6 < 0) goto LAB_001085c7;
      local_40->state = agent_NB_state_request_sent;
    }
    paVar14 = local_40;
    if (local_40->state == agent_NB_state_request_sent) {
      pLVar12 = agent->session;
      p_Var2 = pLVar12->recv;
      lVar1 = agent->fd;
      uVar13 = 0;
      do {
        if (3 < uVar13) {
          iVar3 = (int)uVar13;
          break;
        }
        paVar7 = (agent_transaction_ctx_t)
                 (*p_Var2)(lVar1,local_44 + uVar13,4 - uVar13,0,&pLVar12->abstract);
        paVar10 = (agent_transaction_ctx_t)0x0;
        if (-1 < (long)paVar7) {
          paVar10 = paVar7;
        }
        uVar13 = (long)&paVar10->request + uVar13;
        if (-1 >= (long)paVar7) {
          paVar14 = paVar7;
        }
        iVar3 = (int)paVar14;
      } while (-1 < (long)paVar7);
      if (iVar3 < 0) {
        if (iVar3 == -0xb) {
          return -0x25;
        }
        pLVar12 = agent->session;
        errmsg = "agent recv failed";
        iVar3 = -0x2b;
        goto LAB_001085db;
      }
      uVar4 = _libssh2_ntohu32(local_44);
      paVar14 = local_40;
      local_40->response_len = (ulong)uVar4;
      puVar8 = (uchar *)(*agent->session->alloc)((ulong)uVar4,&agent->session->abstract);
      paVar14->response = puVar8;
      if (puVar8 == (uchar *)0x0) {
        return -6;
      }
      paVar14->state = agent_NB_state_response_length_received;
    }
    if (paVar14->state != agent_NB_state_response_length_received) {
      return 0;
    }
    pLVar12 = agent->session;
    local_38 = pLVar12->recv;
    lVar1 = agent->fd;
    puVar8 = paVar14->response;
    uVar13 = paVar14->response_len;
    uVar5 = 0;
    do {
      sVar11 = uVar13 - uVar5;
      if (uVar13 < uVar5 || sVar11 == 0) {
        iVar3 = (int)uVar5;
        break;
      }
      paVar7 = (agent_transaction_ctx_t)
               (*local_38)(lVar1,puVar8 + uVar5,sVar11,0,&pLVar12->abstract);
      paVar10 = (agent_transaction_ctx_t)0x0;
      if (-1 < (long)paVar7) {
        paVar10 = paVar7;
      }
      uVar5 = (long)&paVar10->request + uVar5;
      if (-1 >= (long)paVar7) {
        paVar14 = paVar7;
      }
      iVar3 = (int)paVar14;
    } while (-1 < (long)paVar7);
    if (-1 < iVar3) {
      local_40->state = agent_NB_state_response_received;
      return 0;
    }
    if (iVar3 == -0xb) {
      return -0x25;
    }
    pLVar12 = agent->session;
    errmsg = "agent recv failed";
  }
  iVar3 = -7;
LAB_001085db:
  iVar3 = _libssh2_error(pLVar12,iVar3,errmsg);
  return iVar3;
}

Assistant:

static int
agent_transact_unix(LIBSSH2_AGENT *agent, agent_transaction_ctx_t transctx)
{
    unsigned char buf[4];
    int rc;

    /* Send the length of the request */
    if(transctx->state == agent_NB_state_request_created) {
        _libssh2_htonu32(buf, (uint32_t)transctx->request_len);
        rc = (int)_send_all(agent->session->send, agent->fd,
                            buf, sizeof(buf), 0,
                            &agent->session->abstract);
        if(rc == -EAGAIN)
            return LIBSSH2_ERROR_EAGAIN;
        else if(rc < 0)
            return _libssh2_error(agent->session, LIBSSH2_ERROR_SOCKET_SEND,
                                  "agent send failed");
        transctx->state = agent_NB_state_request_length_sent;
    }

    /* Send the request body */
    if(transctx->state == agent_NB_state_request_length_sent) {
        rc = (int)_send_all(agent->session->send, agent->fd,
                            transctx->request, transctx->request_len, 0,
                            &agent->session->abstract);
        if(rc == -EAGAIN)
            return LIBSSH2_ERROR_EAGAIN;
        else if(rc < 0)
            return _libssh2_error(agent->session, LIBSSH2_ERROR_SOCKET_SEND,
                                  "agent send failed");
        transctx->state = agent_NB_state_request_sent;
    }

    /* Receive the length of a response */
    if(transctx->state == agent_NB_state_request_sent) {
        rc = (int)_recv_all(agent->session->recv, agent->fd,
                            buf, sizeof(buf), 0,
                            &agent->session->abstract);
        if(rc < 0) {
            if(rc == -EAGAIN)
                return LIBSSH2_ERROR_EAGAIN;
            return _libssh2_error(agent->session, LIBSSH2_ERROR_SOCKET_RECV,
                                  "agent recv failed");
        }
        transctx->response_len = _libssh2_ntohu32(buf);
        transctx->response = LIBSSH2_ALLOC(agent->session,
                                           transctx->response_len);
        if(!transctx->response)
            return LIBSSH2_ERROR_ALLOC;

        transctx->state = agent_NB_state_response_length_received;
    }

    /* Receive the response body */
    if(transctx->state == agent_NB_state_response_length_received) {
        rc = (int)_recv_all(agent->session->recv, agent->fd,
                            transctx->response, transctx->response_len, 0,
                            &agent->session->abstract);
        if(rc < 0) {
            if(rc == -EAGAIN)
                return LIBSSH2_ERROR_EAGAIN;
            return _libssh2_error(agent->session, LIBSSH2_ERROR_SOCKET_SEND,
                                  "agent recv failed");
        }
        transctx->state = agent_NB_state_response_received;
    }

    return 0;
}